

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_DUBT_findBestMatch
                 (ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,size_t *offBasePtr,U32 mls,
                 ZSTD_dictMode_e dictMode)

{
  BYTE *pBVar1;
  BYTE *pBVar2;
  U32 *pUVar3;
  BYTE *pBVar4;
  ZSTD_matchState_t *pZVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  uint *puVar12;
  ulong uVar13;
  ulong uVar14;
  size_t sVar15;
  uint *puVar16;
  char cVar17;
  int iVar18;
  uint uVar19;
  U32 *pUVar20;
  uint uVar21;
  uint uVar22;
  U32 *pUVar23;
  uint uVar24;
  ulong uVar25;
  BYTE *pBVar26;
  ulong uVar27;
  uint uVar28;
  uint uVar29;
  int iVar30;
  char *__assertion;
  uint uVar31;
  ulong uVar32;
  U32 UVar33;
  uint uVar34;
  byte *pbVar35;
  byte *pInLimit;
  ulong uVar36;
  U32 UVar37;
  int iVar38;
  BYTE *pBVar39;
  uint *local_108;
  U32 *local_100;
  ulong local_b0;
  U32 dummy32;
  U32 local_44;
  ulong local_40;
  uint *local_38;
  
  uVar21 = (ms->cParams).hashLog;
  if (0x20 < uVar21) {
LAB_001e73db:
    __assert_fail("hBits <= 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
  }
  local_40 = (ulong)(mls - 5);
  cVar17 = (char)uVar21;
  switch(local_40) {
  case 0:
    lVar11 = -0x30e4432345000000;
    break;
  case 1:
    lVar11 = -0x30e4432340650000;
    break;
  case 2:
    lVar11 = -0x30e44323405a9d00;
    break;
  case 3:
    uVar32 = *(long *)ip * -0x30e44323485a9b9d;
    goto LAB_001e6976;
  default:
    uVar32 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >> (-cVar17 & 0x1fU));
    goto LAB_001e697b;
  }
  uVar32 = lVar11 * *(long *)ip;
LAB_001e6976:
  uVar32 = uVar32 >> (-cVar17 & 0x3fU);
LAB_001e697b:
  pBVar2 = (ms->window).base;
  uVar31 = (int)ip - (int)pBVar2;
  uVar21 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  UVar37 = (ms->window).lowLimit;
  UVar33 = uVar31 - uVar21;
  if (uVar31 - UVar37 <= uVar21) {
    UVar33 = UVar37;
  }
  if (ms->loadedDictEnd != 0) {
    UVar33 = UVar37;
  }
  uVar21 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
  uVar28 = uVar31 - uVar21;
  if (uVar31 < uVar21) {
    uVar28 = 0;
  }
  uVar34 = UVar33;
  if (UVar33 < uVar28) {
    uVar34 = uVar28;
  }
  uVar22 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
  if (iend + -8 < ip) {
    __assert_fail("ip <= iend-8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x107,
                  "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                 );
  }
  if (dictMode == ZSTD_dedicatedDictSearch) {
    __assert_fail("dictMode != ZSTD_dedicatedDictSearch",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x108,
                  "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                 );
  }
  local_38 = ms->hashTable + uVar32;
  pUVar3 = ms->chainTable;
  puVar12 = local_38;
  uVar29 = uVar22;
  uVar7 = 0;
  while (uVar8 = *puVar12, uVar34 < uVar8) {
    puVar12 = pUVar3 + (uVar8 & uVar21) * 2;
    if ((puVar12[1] != 1) || (uVar29 < 2)) {
      if (puVar12[1] == 1) {
        puVar12[0] = 0;
        puVar12[1] = 0;
      }
      break;
    }
    puVar12[1] = uVar7;
    uVar29 = uVar29 - 1;
    uVar7 = uVar8;
  }
  do {
    if (uVar7 == 0) break;
    pBVar4 = (ms->window).dictBase;
    uVar8 = (ms->window).dictLimit;
    uVar32 = (ulong)uVar8;
    pInLimit = iend;
    pBVar39 = pBVar2;
    if (uVar7 < uVar8) {
      pInLimit = pBVar4 + uVar32;
      pBVar39 = pBVar4;
    }
    uVar19 = (ms->window).lowLimit;
    bVar6 = (byte)(ms->cParams).windowLog & 0x1f;
    uVar9 = 1 << bVar6;
    uVar24 = uVar7 - uVar9;
    if (uVar7 - uVar19 <= uVar9) {
      uVar24 = uVar19;
    }
    if (uVar7 < uVar34) {
      __assertion = "curr >= btLow";
      uVar21 = 0x60;
LAB_001e7384:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                    ,uVar21,
                    "void ZSTD_insertDUBT1(const ZSTD_matchState_t *, U32, const BYTE *, U32, U32, const ZSTD_dictMode_e)"
                   );
    }
    pbVar35 = pBVar39 + uVar7;
    if (pInLimit <= pbVar35) {
      __assertion = "ip < iend";
      uVar21 = 0x61;
      goto LAB_001e7384;
    }
    uVar19 = pUVar3[(ulong)((uVar7 & uVar21) * 2) + 1];
    uVar10 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
    local_100 = pUVar3 + (uVar7 & uVar10) * 2;
    UVar37 = *local_100;
    uVar9 = 0 << bVar6;
    uVar25 = 0;
    uVar14 = 0;
    pUVar23 = local_100 + 1;
LAB_001e6b71:
    if ((uVar29 == uVar9) || (UVar37 <= uVar24)) goto LAB_001e6d22;
    uVar13 = uVar25;
    if (uVar14 < uVar25) {
      uVar13 = uVar14;
    }
    if (uVar7 <= UVar37) {
      __assertion = "matchIndex < curr";
      uVar21 = 0x66;
      goto LAB_001e7384;
    }
    uVar27 = (ulong)UVar37;
    uVar36 = uVar13 + uVar27;
    pBVar39 = pBVar2;
    if (dictMode == ZSTD_extDict) {
      if ((uVar7 < uVar8) || (uVar32 <= uVar36)) {
        if (uVar36 < uVar32) {
          pBVar39 = pBVar4;
        }
        goto LAB_001e6c2e;
      }
      sVar15 = ZSTD_count_2segments
                         (pbVar35 + uVar13,pBVar4 + uVar27 + uVar13,pInLimit,pBVar4 + uVar32,
                          pBVar2 + uVar32);
      uVar13 = sVar15 + uVar13;
      pBVar39 = pBVar2 + uVar27;
      if (uVar13 + uVar27 < uVar32) {
        pBVar39 = pBVar4 + uVar27;
      }
    }
    else {
LAB_001e6c2e:
      if ((uVar8 <= uVar7) && (uVar36 < uVar32)) {
        __assertion = "(matchIndex+matchLength >= dictLimit) || (curr < dictLimit)";
        uVar21 = 0x72;
        goto LAB_001e7384;
      }
      sVar15 = ZSTD_count(pbVar35 + uVar13,pBVar39 + uVar27 + uVar13,pInLimit);
      uVar13 = sVar15 + uVar13;
      pBVar39 = pBVar39 + uVar27;
    }
    if (pbVar35 + uVar13 == pInLimit) goto LAB_001e6d22;
    pUVar20 = pUVar3 + (UVar37 & uVar10) * 2;
    if (pbVar35[uVar13] <= pBVar39[uVar13]) {
      *pUVar23 = UVar37;
      pUVar23 = pUVar20;
      uVar25 = uVar13;
      if (UVar37 <= uVar34) {
        pUVar23 = &local_44;
        goto LAB_001e6d22;
      }
LAB_001e6ce9:
      UVar37 = *pUVar23;
      uVar9 = uVar9 + 1;
      pUVar23 = pUVar20;
      goto LAB_001e6b71;
    }
    *local_100 = UVar37;
    if (uVar34 < UVar37) {
      local_100 = pUVar20 + 1;
      pUVar20 = pUVar23;
      pUVar23 = local_100;
      uVar14 = uVar13;
      goto LAB_001e6ce9;
    }
    local_100 = &local_44;
LAB_001e6d22:
    *pUVar23 = 0;
    *local_100 = 0;
    uVar29 = uVar29 + 1;
    uVar7 = uVar19;
  } while( true );
  pBVar4 = (ms->window).dictBase;
  uVar13 = (ulong)(ms->window).dictLimit;
  uVar14 = (ulong)((uVar21 & uVar31) * 2);
  local_108 = pUVar3 + uVar14;
  uVar29 = uVar31 + 9;
  uVar34 = *local_38;
  *local_38 = uVar31;
  uVar32 = 0;
  uVar25 = 0;
  local_b0 = 0;
  puVar12 = pUVar3 + uVar14 + 1;
LAB_001e6db3:
  uVar14 = (ulong)uVar34;
  if ((uVar22 == 0) || (uVar34 <= UVar33)) goto LAB_001e6fee;
  uVar36 = uVar25;
  if (uVar32 < uVar25) {
    uVar36 = uVar32;
  }
  if ((dictMode == ZSTD_extDict) && (uVar36 + uVar14 < uVar13)) {
    pBVar1 = pBVar4 + uVar14;
    sVar15 = ZSTD_count_2segments(ip + uVar36,pBVar1 + uVar36,iend,pBVar4 + uVar13,pBVar2 + uVar13);
    uVar36 = sVar15 + uVar36;
    pBVar39 = pBVar2 + uVar14;
    if (uVar36 + uVar14 < uVar13) {
      pBVar39 = pBVar1;
    }
  }
  else {
    sVar15 = ZSTD_count(ip + uVar36,pBVar2 + uVar14 + uVar36,iend);
    uVar36 = sVar15 + uVar36;
    pBVar39 = pBVar2 + uVar14;
  }
  if (local_b0 < uVar36) {
    if (uVar29 - uVar34 < uVar36) {
      uVar29 = uVar34 + (int)uVar36;
    }
    uVar7 = ZSTD_highbit32((uVar31 - uVar34) + 1);
    uVar8 = ZSTD_highbit32((U32)*offBasePtr);
    if ((int)(uVar7 - uVar8) < ((int)uVar36 - (int)local_b0) * 4) {
      if (uVar31 == uVar34) {
        __assert_fail("(curr - matchIndex)>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                      ,0x14e,
                      "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                     );
      }
      *offBasePtr = (ulong)((uVar31 - uVar34) + 3);
      local_b0 = uVar36;
    }
    if (ip + uVar36 == iend) {
      if (dictMode == ZSTD_dictMatchState) {
        *puVar12 = 0;
        *local_108 = 0;
        goto LAB_001e72fe;
      }
LAB_001e6fee:
      *puVar12 = 0;
      *local_108 = 0;
      if (0x40000000 < uVar22) {
        __assert_fail("nbCompares <= (1U << ZSTD_SEARCHLOG_MAX)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                      ,0x16b,
                      "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                     );
      }
      if (dictMode == ZSTD_dictMatchState && uVar22 != 0) {
        pZVar5 = ms->dictMatchState;
        uVar21 = (pZVar5->cParams).hashLog;
        if (0x20 < uVar21) goto LAB_001e73db;
        if ((uint)local_40 < 4) {
          sVar15 = (*(code *)(&DAT_002453e8 + *(int *)(&DAT_002453e8 + local_40 * 4)))
                             (&DAT_002453e8 + *(int *)(&DAT_002453e8 + local_40 * 4));
          return sVar15;
        }
        puVar12 = pZVar5->hashTable + ((uint)(*(int *)ip * -0x61c8864f) >> (-(char)uVar21 & 0x1fU));
        pBVar2 = (ms->window).base;
        uVar21 = (ms->window).dictLimit;
        iVar30 = (int)ip - (int)pBVar2;
        pBVar4 = (pZVar5->window).nextSrc;
        pBVar39 = (pZVar5->window).base;
        uVar32 = (long)pBVar4 - (long)pBVar39;
        uVar28 = (pZVar5->window).lowLimit;
        iVar18 = (int)uVar32;
        uVar8 = (ms->window).lowLimit - iVar18;
        pUVar3 = pZVar5->chainTable;
        uVar7 = ~(-1 << ((char)(pZVar5->cParams).chainLog - 1U & 0x1f));
        uVar34 = iVar18 - uVar7;
        if (iVar18 - uVar28 <= uVar7) {
          uVar34 = uVar28;
        }
        uVar25 = 0;
        uVar14 = 0;
        for (uVar19 = 0; uVar22 != uVar19; uVar19 = uVar19 + 1) {
          uVar24 = *puVar12;
          uVar13 = (ulong)uVar24;
          if (uVar24 <= uVar28) break;
          uVar36 = uVar14;
          if (uVar25 < uVar14) {
            uVar36 = uVar25;
          }
          pBVar1 = pBVar39 + uVar13;
          sVar15 = ZSTD_count_2segments(ip + uVar36,pBVar1 + uVar36,iend,pBVar4,pBVar2 + uVar21);
          uVar36 = sVar15 + uVar36;
          pBVar26 = pBVar2 + uVar13 + uVar8;
          if (uVar36 + uVar13 < (uVar32 & 0xffffffff)) {
            pBVar26 = pBVar1;
          }
          if (local_b0 < uVar36) {
            iVar18 = uVar8 + uVar24;
            iVar38 = iVar30 - iVar18;
            uVar9 = ZSTD_highbit32(iVar38 + 1);
            uVar10 = ZSTD_highbit32((int)*offBasePtr + 1);
            if ((int)(uVar9 - uVar10) < ((int)uVar36 - (int)local_b0) * 4) {
              if (iVar30 == iVar18) {
                __assert_fail("(curr - matchIndex)>0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                              ,0xcc,
                              "size_t ZSTD_DUBT_findBetterDictMatch(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, size_t, U32, const U32, const ZSTD_dictMode_e)"
                             );
              }
              *offBasePtr = (ulong)(iVar38 + 3);
              local_b0 = uVar36;
            }
            if (ip + uVar36 == iend) break;
          }
          puVar12 = pUVar3 + (uVar24 & uVar7) * 2;
          if (pBVar26[uVar36] < ip[uVar36]) {
            if (uVar24 <= uVar34) break;
            puVar12 = puVar12 + 1;
            uVar25 = uVar36;
          }
          else {
            uVar14 = uVar36;
            if (uVar24 <= uVar34) break;
          }
        }
        if ((2 < local_b0) && (*offBasePtr < 4)) {
          __assert_fail("OFFBASE_IS_OFFSET(*offsetPtr)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                        ,0xe0,
                        "size_t ZSTD_DUBT_findBetterDictMatch(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, size_t, U32, const U32, const ZSTD_dictMode_e)"
                       );
        }
      }
LAB_001e72fe:
      if (uVar29 <= uVar31 + 8) {
        __assert_fail("matchEndIdx > curr+8",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                      ,0x173,
                      "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                     );
      }
      ms->nextToUpdate = uVar29 - 8;
      if ((2 < local_b0) && (*offBasePtr < 4)) {
        __assert_fail("OFFBASE_IS_OFFSET(*offBasePtr)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                      ,0x176,
                      "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                     );
      }
      return local_b0;
    }
  }
  puVar16 = pUVar3 + (uVar34 & uVar21) * 2;
  if (pBVar39[uVar36] < ip[uVar36]) {
    *local_108 = uVar34;
    if (uVar34 <= uVar28) {
      local_108 = &dummy32;
      goto LAB_001e6fee;
    }
    local_108 = puVar16 + 1;
    puVar16 = puVar12;
    puVar12 = local_108;
    uVar32 = uVar36;
  }
  else {
    *puVar12 = uVar34;
    puVar12 = puVar16;
    uVar25 = uVar36;
    if (uVar34 <= uVar28) {
      puVar12 = &dummy32;
      goto LAB_001e6fee;
    }
  }
  uVar34 = *puVar12;
  puVar12 = puVar16;
  uVar22 = uVar22 - 1;
  goto LAB_001e6db3;
}

Assistant:

static size_t
ZSTD_DUBT_findBestMatch(ZSTD_matchState_t* ms,
                        const BYTE* const ip, const BYTE* const iend,
                        size_t* offBasePtr,
                        U32 const mls,
                        const ZSTD_dictMode_e dictMode)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32*   const hashTable = ms->hashTable;
    U32    const hashLog = cParams->hashLog;
    size_t const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32          matchIndex  = hashTable[h];

    const BYTE* const base = ms->window.base;
    U32    const curr = (U32)(ip-base);
    U32    const windowLow = ZSTD_getLowestMatchIndex(ms, curr, cParams->windowLog);

    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    U32    const btLow = (btMask >= curr) ? 0 : curr - btMask;
    U32    const unsortLimit = MAX(btLow, windowLow);

    U32*         nextCandidate = bt + 2*(matchIndex&btMask);
    U32*         unsortedMark = bt + 2*(matchIndex&btMask) + 1;
    U32          nbCompares = 1U << cParams->searchLog;
    U32          nbCandidates = nbCompares;
    U32          previousCandidate = 0;

    DEBUGLOG(7, "ZSTD_DUBT_findBestMatch (%u) ", curr);
    assert(ip <= iend-8);   /* required for h calculation */
    assert(dictMode != ZSTD_dedicatedDictSearch);

    /* reach end of unsorted candidates list */
    while ( (matchIndex > unsortLimit)
         && (*unsortedMark == ZSTD_DUBT_UNSORTED_MARK)
         && (nbCandidates > 1) ) {
        DEBUGLOG(8, "ZSTD_DUBT_findBestMatch: candidate %u is unsorted",
                    matchIndex);
        *unsortedMark = previousCandidate;  /* the unsortedMark becomes a reversed chain, to move up back to original position */
        previousCandidate = matchIndex;
        matchIndex = *nextCandidate;
        nextCandidate = bt + 2*(matchIndex&btMask);
        unsortedMark = bt + 2*(matchIndex&btMask) + 1;
        nbCandidates --;
    }

    /* nullify last candidate if it's still unsorted
     * simplification, detrimental to compression ratio, beneficial for speed */
    if ( (matchIndex > unsortLimit)
      && (*unsortedMark==ZSTD_DUBT_UNSORTED_MARK) ) {
        DEBUGLOG(7, "ZSTD_DUBT_findBestMatch: nullify last unsorted candidate %u",
                    matchIndex);
        *nextCandidate = *unsortedMark = 0;
    }

    /* batch sort stacked candidates */
    matchIndex = previousCandidate;
    while (matchIndex) {  /* will end on matchIndex == 0 */
        U32* const nextCandidateIdxPtr = bt + 2*(matchIndex&btMask) + 1;
        U32 const nextCandidateIdx = *nextCandidateIdxPtr;
        ZSTD_insertDUBT1(ms, matchIndex, iend,
                         nbCandidates, unsortLimit, dictMode);
        matchIndex = nextCandidateIdx;
        nbCandidates++;
    }

    /* find longest match */
    {   size_t commonLengthSmaller = 0, commonLengthLarger = 0;
        const BYTE* const dictBase = ms->window.dictBase;
        const U32 dictLimit = ms->window.dictLimit;
        const BYTE* const dictEnd = dictBase + dictLimit;
        const BYTE* const prefixStart = base + dictLimit;
        U32* smallerPtr = bt + 2*(curr&btMask);
        U32* largerPtr  = bt + 2*(curr&btMask) + 1;
        U32 matchEndIdx = curr + 8 + 1;
        U32 dummy32;   /* to be nullified at the end */
        size_t bestLength = 0;

        matchIndex  = hashTable[h];
        hashTable[h] = curr;   /* Update Hash Table */

        for (; nbCompares && (matchIndex > windowLow); --nbCompares) {
            U32* const nextPtr = bt + 2*(matchIndex & btMask);
            size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
            const BYTE* match;

            if ((dictMode != ZSTD_extDict) || (matchIndex+matchLength >= dictLimit)) {
                match = base + matchIndex;
                matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
            } else {
                match = dictBase + matchIndex;
                matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
                if (matchIndex+matchLength >= dictLimit)
                    match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
            }

            if (matchLength > bestLength) {
                if (matchLength > matchEndIdx - matchIndex)
                    matchEndIdx = matchIndex + (U32)matchLength;
                if ( (4*(int)(matchLength-bestLength)) > (int)(ZSTD_highbit32(curr - matchIndex + 1) - ZSTD_highbit32((U32)*offBasePtr)) )
                    bestLength = matchLength, *offBasePtr = OFFSET_TO_OFFBASE(curr - matchIndex);
                if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
                    if (dictMode == ZSTD_dictMatchState) {
                        nbCompares = 0; /* in addition to avoiding checking any
                                         * further in this loop, make sure we
                                         * skip checking in the dictionary. */
                    }
                    break;   /* drop, to guarantee consistency (miss a little bit of compression) */
                }
            }

            if (match[matchLength] < ip[matchLength]) {
                /* match is smaller than current */
                *smallerPtr = matchIndex;             /* update smaller idx */
                commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
                if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                smallerPtr = nextPtr+1;               /* new "smaller" => larger of match */
                matchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
            } else {
                /* match is larger than current */
                *largerPtr = matchIndex;
                commonLengthLarger = matchLength;
                if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                largerPtr = nextPtr;
                matchIndex = nextPtr[0];
        }   }

        *smallerPtr = *largerPtr = 0;

        assert(nbCompares <= (1U << ZSTD_SEARCHLOG_MAX)); /* Check we haven't underflowed. */
        if (dictMode == ZSTD_dictMatchState && nbCompares) {
            bestLength = ZSTD_DUBT_findBetterDictMatch(
                    ms, ip, iend,
                    offBasePtr, bestLength, nbCompares,
                    mls, dictMode);
        }

        assert(matchEndIdx > curr+8); /* ensure nextToUpdate is increased */
        ms->nextToUpdate = matchEndIdx - 8;   /* skip repetitive patterns */
        if (bestLength >= MINMATCH) {
            U32 const mIndex = curr - (U32)OFFBASE_TO_OFFSET(*offBasePtr); (void)mIndex;
            DEBUGLOG(8, "ZSTD_DUBT_findBestMatch(%u) : found match of length %u and offsetCode %u (pos %u)",
                        curr, (U32)bestLength, (U32)*offBasePtr, mIndex);
        }
        return bestLength;
    }
}